

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O3

void Minisat::sort<Minisat::Option*,Minisat::Option::OptionLt>(long array,ulong param_2)

{
  undefined8 *puVar1;
  long lVar2;
  Option *y;
  undefined8 uVar3;
  bool bVar4;
  undefined4 in_EAX;
  undefined8 *puVar5;
  ulong uVar6;
  undefined4 uStack_38;
  int local_34;
  
  if ((int)param_2 < 0x10) {
    selectionSort<Minisat::Option*,Minisat::Option::OptionLt>(array);
    return;
  }
  y = *(Option **)(array + (param_2 >> 1 & 0x7fffffff) * 8);
  uVar6 = 0xffffffffffffffff;
  _uStack_38 = CONCAT44((int)param_2,in_EAX);
  param_2 = param_2 & 0xffffffff;
  while( true ) {
    uVar6 = (ulong)(int)uVar6;
    puVar5 = (undefined8 *)(array + uVar6 * 8);
    do {
      uVar6 = uVar6 + 1;
      puVar1 = puVar5 + 1;
      puVar5 = puVar5 + 1;
      bVar4 = Option::OptionLt::operator()((OptionLt *)((long)&uStack_38 + 3),(Option *)*puVar1,y);
    } while (bVar4);
    param_2 = (ulong)(int)param_2;
    do {
      lVar2 = param_2 * 8;
      param_2 = param_2 - 1;
      bVar4 = Option::OptionLt::operator()
                        ((OptionLt *)((long)&uStack_38 + 3),y,*(Option **)(array + -8 + lVar2));
    } while (bVar4);
    if ((long)param_2 <= (long)uVar6) break;
    uVar3 = *puVar5;
    *puVar5 = *(undefined8 *)(array + param_2 * 8);
    *(undefined8 *)(array + param_2 * 8) = uVar3;
  }
  sort<Minisat::Option*,Minisat::Option::OptionLt>(array,uVar6 & 0xffffffff);
  sort<Minisat::Option*,Minisat::Option::OptionLt>(puVar5,local_34 - (int)uVar6);
  return;
}

Assistant:

void sort(T* array, int size, LessThan lt)
{
    if (size <= 15)
        selectionSort(array, size, lt);

    else{
        T           pivot = array[size / 2];
        T           tmp;
        int         i = -1;
        int         j = size;

        for(;;){
            do i++; while(lt(array[i], pivot));
            do j--; while(lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i]; array[i] = array[j]; array[j] = tmp;
        }

        sort(array    , i     , lt);
        sort(&array[i], size-i, lt);
    }
}